

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void RenderArrowsForVerticalBar(ImDrawList *draw_list,ImVec2 pos,ImVec2 half_sz,float bar_w)

{
  float in_XMM0_Dc;
  float in_XMM0_Dd;
  float fVar1;
  float fVar2;
  float in_XMM1_Dc;
  float in_XMM1_Dd;
  ImVec2 local_e0;
  ImVec2 local_d8;
  ImVec2 local_d0;
  float local_c8;
  float fStack_c4;
  float fStack_c0;
  float fStack_bc;
  float local_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  float local_a8;
  float fStack_a4;
  float local_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  float local_88;
  float fStack_84;
  float fStack_80;
  float fStack_7c;
  float local_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  float local_68;
  float fStack_64;
  float fStack_60;
  float fStack_5c;
  undefined1 local_58 [16];
  float local_48;
  undefined1 local_38 [16];
  
  fVar1 = half_sz.x;
  fVar2 = half_sz.y;
  fStack_c4 = pos.y;
  local_78 = pos.x + fVar1;
  fStack_84 = fStack_c4 + fVar2;
  fStack_80 = in_XMM0_Dc + in_XMM1_Dc;
  fStack_7c = in_XMM0_Dd + in_XMM1_Dd;
  local_d8.y = fStack_c4;
  local_d8.x = local_78 + 1.0;
  local_38._8_4_ = in_XMM1_Dc;
  local_38._0_8_ = half_sz;
  local_38._12_4_ = in_XMM1_Dd;
  local_d0.x = (local_78 + 1.0) - (fVar1 + 2.0);
  local_68 = fStack_c4 - (fVar2 + 1.0);
  local_e0.y = local_68;
  local_e0.x = local_d0.x;
  local_88 = local_78 - fVar1;
  local_b8 = fStack_c4 + fVar2;
  local_c8 = fStack_c4 - fVar2;
  local_58._8_4_ = in_XMM0_Dc;
  local_58._0_8_ = pos;
  local_58._12_4_ = in_XMM0_Dd;
  local_48 = (bar_w + pos.x) - fVar1;
  local_a8 = local_48 + -1.0;
  local_98 = fVar1 + 2.0 + local_a8;
  local_d0.y = fVar2 + 1.0 + fStack_c4;
  fStack_90 = in_XMM1_Dc + 0.0 + in_XMM0_Dc;
  fStack_8c = in_XMM1_Dd + 0.0 + in_XMM0_Dd;
  fStack_c0 = fStack_c4;
  fStack_bc = fStack_c4;
  fStack_b4 = fStack_c4;
  fStack_b0 = fStack_c4;
  fStack_ac = fStack_c4;
  fStack_a4 = fStack_c4;
  fStack_94 = local_d0.y;
  fStack_74 = fStack_c4;
  fStack_70 = fStack_80;
  fStack_6c = fStack_7c;
  fStack_64 = local_68;
  fStack_60 = local_68;
  fStack_5c = local_68;
  ImDrawList::AddTriangleFilled(draw_list,&local_d0,&local_e0,&local_d8,0xff000000);
  local_d8.y = fStack_74;
  local_d8.x = local_78;
  local_d0.x = local_88;
  local_d0.y = local_b8;
  local_e0.y = local_c8;
  local_e0.x = local_88;
  ImDrawList::AddTriangleFilled(draw_list,&local_d0,&local_e0,&local_d8,0xffffffff);
  local_d8.y = fStack_a4;
  local_d8.x = local_a8;
  local_d0.x = local_98;
  local_d0.y = local_68;
  local_e0.y = fStack_94;
  local_e0.x = local_98;
  ImDrawList::AddTriangleFilled(draw_list,&local_d0,&local_e0,&local_d8,0xff000000);
  local_d8.y = (float)local_58._4_4_;
  local_d8.x = local_48;
  local_d0.x = local_48 + (float)local_38._0_4_;
  local_d0.y = local_c8;
  local_e0.y = local_b8;
  local_e0.x = local_d0.x;
  ImDrawList::AddTriangleFilled(draw_list,&local_d0,&local_e0,&local_d8,0xffffffff);
  return;
}

Assistant:

static void RenderArrowsForVerticalBar(ImDrawList* draw_list, ImVec2 pos, ImVec2 half_sz, float bar_w)
{
    RenderArrow(draw_list, ImVec2(pos.x + half_sz.x + 1,         pos.y), ImVec2(half_sz.x + 2, half_sz.y + 1), ImGuiDir_Right, IM_COL32_BLACK);
    RenderArrow(draw_list, ImVec2(pos.x + half_sz.x,             pos.y), half_sz,                              ImGuiDir_Right, IM_COL32_WHITE);
    RenderArrow(draw_list, ImVec2(pos.x + bar_w - half_sz.x - 1, pos.y), ImVec2(half_sz.x + 2, half_sz.y + 1), ImGuiDir_Left,  IM_COL32_BLACK);
    RenderArrow(draw_list, ImVec2(pos.x + bar_w - half_sz.x,     pos.y), half_sz,                              ImGuiDir_Left,  IM_COL32_WHITE);
}